

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::TestCaseStats::TestCaseStats
          (TestCaseStats *this,TestCaseInfo *_testInfo,Totals *_totals,string *_stdOut,
          string *_stdErr,bool _aborting)

{
  byte bVar1;
  undefined1 in_CL;
  undefined7 in_register_00000009;
  undefined8 *in_RDI;
  string *in_R8;
  byte in_R9B;
  Totals *in_stack_ffffffffffffff98;
  Totals *in_stack_ffffffffffffffa0;
  TestCaseInfo *in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffd0;
  
  bVar1 = in_R9B & 1;
  *in_RDI = &PTR__TestCaseStats_00294900;
  TestCaseInfo::TestCaseInfo
            ((TestCaseInfo *)(CONCAT17(in_R9B,in_stack_ffffffffffffffd0) & 0x1ffffffffffffff),
             in_stack_ffffffffffffffc8);
  Totals::Totals(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  std::__cxx11::string::string
            ((string *)(in_RDI + 0x24),(string *)CONCAT71(in_register_00000009,in_CL));
  std::__cxx11::string::string((string *)(in_RDI + 0x28),in_R8);
  *(byte *)(in_RDI + 0x2c) = bVar1 & 1;
  return;
}

Assistant:

TestCaseStats::TestCaseStats(  TestCaseInfo const& _testInfo,
                                   Totals const& _totals,
                                   std::string const& _stdOut,
                                   std::string const& _stdErr,
                                   bool _aborting )
    : testInfo( _testInfo ),
        totals( _totals ),
        stdOut( _stdOut ),
        stdErr( _stdErr ),
        aborting( _aborting )
    {}